

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::addLabel(SymbolData *this,int64_t memoryAddress,string *name)

{
  bool bVar1;
  __type _Var2;
  reference pvVar3;
  reference __lhs;
  SymDataSymbol *symbol;
  iterator __end1;
  iterator __begin1;
  vector<SymDataSymbol,_std::allocator<SymDataSymbol>_> *__range1;
  undefined1 local_48 [8];
  SymDataSymbol sym;
  string *name_local;
  int64_t memoryAddress_local;
  SymbolData *this_local;
  
  if ((this->enabled & 1U) != 0) {
    sym.address = (int64_t)name;
    SymDataSymbol::SymDataSymbol((SymDataSymbol *)local_48);
    sym.name.field_2._8_8_ = memoryAddress;
    std::__cxx11::string::operator=((string *)local_48,(string *)sym.address);
    pvVar3 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                       (&this->modules,(long)this->currentModule);
    __end1 = std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::begin(&pvVar3->symbols);
    symbol = (SymDataSymbol *)
             std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::end(&pvVar3->symbols);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<SymDataSymbol_*,_std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>_>
                                       *)&symbol), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<SymDataSymbol_*,_std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>_>
              ::operator*(&__end1);
      if ((__lhs->address == sym.name.field_2._8_8_) &&
         (_Var2 = std::operator==(&__lhs->name,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48), _Var2)) goto LAB_00172b95;
      __gnu_cxx::
      __normal_iterator<SymDataSymbol_*,_std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>_>
      ::operator++(&__end1);
    }
    pvVar3 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                       (&this->modules,(long)this->currentModule);
    std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::push_back
              (&pvVar3->symbols,(value_type *)local_48);
LAB_00172b95:
    SymDataSymbol::~SymDataSymbol((SymDataSymbol *)local_48);
  }
  return;
}

Assistant:

void SymbolData::addLabel(int64_t memoryAddress, const std::string& name)
{
	if (!enabled)
		return;
	
	SymDataSymbol sym;
	sym.address = memoryAddress;
	sym.name = name;

	for (SymDataSymbol& symbol: modules[currentModule].symbols)
	{
		if (symbol.address == sym.address && symbol.name == sym.name)
			return;
	}

	modules[currentModule].symbols.push_back(sym);
}